

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_decompress4X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  BYTE *pBVar1;
  BYTE **ppBVar2;
  byte bVar3;
  byte bVar4;
  undefined2 *puVar5;
  BYTE *pBVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  BIT_DStream_status BVar12;
  BIT_DStream_status BVar13;
  BIT_DStream_status BVar14;
  BIT_DStream_status BVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  undefined2 *puVar19;
  undefined2 *puVar20;
  undefined2 *puVar21;
  uint uVar22;
  BYTE *pBVar23;
  void *pvVar24;
  BYTE *pBVar25;
  ushort *puVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  BYTE *pStart;
  undefined2 *puVar30;
  BYTE *pBVar31;
  bool bVar32;
  U64 bits [4];
  char *local_1a8;
  undefined2 *local_1a0;
  BYTE *ip [4];
  BYTE *local_178;
  undefined1 local_168 [16];
  BYTE *local_158;
  BYTE *pBStack_150;
  BYTE *local_148;
  undefined2 *local_138;
  ushort *local_130;
  undefined2 *local_128;
  undefined2 *local_120;
  BYTE *local_118;
  size_t local_110;
  undefined2 *local_108;
  undefined2 *local_100;
  HUF_DecompressFastArgs args;
  BYTE *local_58 [5];
  
  if ((flags & 0x20U) == 0) {
    local_138 = (undefined2 *)cSrcSize;
    local_110 = HUF_DecompressFastArgs_init(&args,dst,dstSize,cSrc,cSrcSize,DTable);
    if (local_110 - 1 < 0xffffffffffffff88) {
      if (args.ip[0] < args.ilimit) {
        __assert_fail("args.ip[0] >= args.ilimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x658,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      local_130 = (ushort *)cSrc;
      local_118 = (BYTE *)((long)cSrc + 6);
      local_110 = dstSize;
      pBVar1 = (BYTE *)((long)dst + dstSize);
      bits[0] = args.bits[0];
      bits[1] = args.bits[1];
      bits[2] = args.bits[2];
      bits[3] = args.bits[3];
      ip[0] = args.ip[0];
      ip[1] = args.ip[1];
      ip[2] = args.ip[2];
      ip[3] = args.ip[3];
      local_168._0_8_ = args.op[0];
      local_168._8_8_ = args.op[1];
      local_158 = args.op[2];
      pBStack_150 = args.op[3];
      local_58[0] = args.op[1];
      local_58[1] = args.op[2];
      local_58[2] = args.op[3];
      local_58[3] = args.oend;
      pBVar31 = args.op[3];
      while( true ) {
        lVar28 = 0;
        while (pBStack_150 = pBVar31, lVar28 != 4) {
          if (local_58[lVar28] < *(BYTE **)(local_168 + lVar28 * 8)) {
            __assert_fail("op[stream] <= oend[stream]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                          ,0x5da,
                          "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                         );
          }
          ppBVar2 = ip + lVar28;
          lVar28 = lVar28 + 1;
          if (*ppBVar2 < args.ilimit) {
            __assert_fail("ip[stream] >= ilimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                          ,0x5db,
                          "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                         );
          }
        }
        uVar16 = (ulong)((long)ip[0] - (long)args.ilimit) / 7;
        for (lVar28 = 0; lVar28 != 4; lVar28 = lVar28 + 1) {
          uVar17 = (ulong)((long)local_58[lVar28] - *(long *)(local_168 + lVar28 * 8)) / 10;
          if (uVar17 <= uVar16) {
            uVar16 = uVar17;
          }
        }
        if (((((long)(uVar16 * 5) < 10) || (ip[1] < ip[0])) || (ip[2] < ip[1])) || (ip[3] < ip[2]))
        break;
        pBVar25 = pBVar31 + uVar16 * 5;
        iVar11 = 0;
        do {
          for (; iVar11 != 5; iVar11 = iVar11 + 1) {
            for (lVar28 = 0; lVar28 != 3; lVar28 = lVar28 + 1) {
              uVar16 = bits[lVar28];
              uVar17 = uVar16 >> 0x35;
              bVar3 = *(byte *)((long)args.dt + uVar17 * 4 + 2);
              bVar4 = *(byte *)((long)args.dt + uVar17 * 4 + 3);
              puVar5 = *(undefined2 **)(local_168 + lVar28 * 8);
              *puVar5 = *(undefined2 *)((long)args.dt + uVar17 * 4);
              bits[lVar28] = uVar16 << (bVar3 & 0x3f);
              *(ulong *)(local_168 + lVar28 * 8) = (ulong)bVar4 + (long)puVar5;
            }
          }
          uVar16 = bits[3] >> 0x35;
          bVar3 = *(byte *)((long)args.dt + uVar16 * 4 + 2);
          bVar4 = *(byte *)((long)args.dt + uVar16 * 4 + 3);
          *(undefined2 *)pBStack_150 = *(undefined2 *)((long)args.dt + uVar16 * 4);
          bits[3] = bits[3] << (bVar3 & 0x3f);
          pBVar31 = pBStack_150 + bVar4;
          for (lVar28 = 0; lVar28 != 4; lVar28 = lVar28 + 1) {
            uVar16 = bits[3] >> 0x35;
            bVar3 = *(byte *)((long)args.dt + uVar16 * 4 + 2);
            bVar4 = *(byte *)((long)args.dt + uVar16 * 4 + 3);
            *(undefined2 *)pBVar31 = *(undefined2 *)((long)args.dt + uVar16 * 4);
            bits[3] = bits[3] << (bVar3 & 0x3f);
            pBVar31 = pBVar31 + bVar4;
            uVar10 = ZSTD_countTrailingZeros64(bits[lVar28]);
            pBVar23 = ip[lVar28];
            ip[lVar28] = pBVar23 + -(ulong)(uVar10 >> 3);
            bits[lVar28] = (*(ulong *)(pBVar23 + -(ulong)(uVar10 >> 3)) | 1) << ((byte)uVar10 & 7);
          }
          pBStack_150 = pBVar31;
          iVar11 = 0;
        } while (pBVar31 < pBVar25);
      }
      args.bits[2] = bits[2];
      args.bits[3] = bits[3];
      args.bits[0] = bits[0];
      args.bits[1] = bits[1];
      args.ip[0] = ip[0];
      args.ip[1] = ip[1];
      args.ip[2] = ip[2];
      args.ip[3] = ip[3];
      args.op[2] = local_158;
      args.op[0] = (BYTE *)local_168._0_8_;
      args.op[1] = (BYTE *)local_168._8_8_;
      args.op[3] = pBVar31;
      if (ip[0] < local_118) {
        __assert_fail("args.ip[0] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x65c,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (ip[1] < local_118) {
        __assert_fail("args.ip[1] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x65d,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (ip[2] < local_118) {
        __assert_fail("args.ip[2] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x65e,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (ip[3] < local_118) {
        __assert_fail("args.ip[3] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x65f,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (pBVar1 < pBVar31) {
        __assert_fail("args.op[3] <= oend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x660,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      uVar16 = local_110 + 3 >> 2;
      lVar28 = 0;
      pBVar31 = (BYTE *)dst;
      while (dstSize = local_110, cSrc = local_130, lVar28 != 4) {
        uVar17 = (long)pBVar1 - (long)pBVar31;
        pBVar31 = pBVar31 + uVar16;
        if (uVar17 < uVar16) {
          pBVar31 = pBVar1;
        }
        sVar18 = HUF_initRemainingDStream((BIT_DStream_t *)bits,&args,(int)lVar28,pBVar31);
        if (0xffffffffffffff88 < sVar18) {
          return sVar18;
        }
        pBVar25 = args.op[lVar28];
        uVar17 = (long)pBVar31 - (long)pBVar25;
        pBVar23 = pBVar25;
        if (uVar17 < 8) {
          if ((uint)bits[1] < 0x41) {
            if (bits[2] < local_1a8) {
              if (bits[2] != bits[3]) {
                uVar10 = (int)bits[2] - (int)bits[3];
                if (bits[3] <= bits[2] - ((uint)bits[1] >> 3)) {
                  uVar10 = (uint)bits[1] >> 3;
                }
                bits[2] = bits[2] - uVar10;
                bits[1] = CONCAT44(bits[1]._4_4_,(uint)bits[1] + uVar10 * -8);
                bits[0] = *(U64 *)bits[2];
              }
            }
            else {
              BIT_reloadDStreamFast((BIT_DStream_t *)bits);
            }
          }
        }
        else {
          uVar10 = (uint)bits[1];
          while (uVar10 < 0x41) {
            if (bits[2] < local_1a8) {
              if (bits[2] == bits[3]) break;
              bVar32 = bits[2] - (uVar10 >> 3) < bits[3];
              uVar22 = (int)bits[2] - (int)bits[3];
              if (!bVar32) {
                uVar22 = uVar10 >> 3;
              }
              BVar12 = (BIT_DStream_status)bVar32;
              bits[2] = bits[2] - uVar22;
              bits[1] = CONCAT44(bits[1]._4_4_,uVar10 + uVar22 * -8);
              bits[0] = *(U64 *)bits[2];
            }
            else {
              BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)bits);
            }
            if ((pBVar31 + -9 <= pBVar23) || (BVar12 != BIT_DStream_unfinished)) break;
            uVar17 = (bits[0] << ((byte)bits[1] & 0x3f)) >> 0x35;
            *(short *)pBVar23 = (short)DTable[uVar17 + 1];
            iVar11 = *(byte *)((long)DTable + uVar17 * 4 + 6) + (uint)bits[1];
            uVar29 = (ulong)*(byte *)((long)DTable + uVar17 * 4 + 7);
            uVar17 = (bits[0] << ((byte)iVar11 & 0x3f)) >> 0x35;
            *(short *)(pBVar23 + uVar29) = (short)DTable[uVar17 + 1];
            iVar11 = (uint)*(byte *)((long)DTable + uVar17 * 4 + 6) + iVar11;
            uVar17 = (ulong)*(byte *)((long)DTable + uVar17 * 4 + 7);
            lVar8 = uVar17 + uVar29;
            uVar27 = (bits[0] << ((byte)iVar11 & 0x3f)) >> 0x35;
            *(short *)(pBVar23 + uVar17 + uVar29) = (short)DTable[uVar27 + 1];
            iVar11 = (uint)*(byte *)((long)DTable + uVar27 * 4 + 6) + iVar11;
            uVar17 = (ulong)*(byte *)((long)DTable + uVar27 * 4 + 7);
            lVar9 = uVar17 + lVar8;
            uVar29 = (bits[0] << ((byte)iVar11 & 0x3f)) >> 0x35;
            *(short *)(pBVar23 + uVar17 + lVar8) = (short)DTable[uVar29 + 1];
            iVar11 = (uint)*(byte *)((long)DTable + uVar29 * 4 + 6) + iVar11;
            uVar17 = (ulong)*(byte *)((long)DTable + uVar29 * 4 + 7);
            uVar29 = (bits[0] << ((byte)iVar11 & 0x3f)) >> 0x35;
            *(short *)(pBVar23 + uVar17 + lVar9) = (short)DTable[uVar29 + 1];
            uVar10 = (uint)*(byte *)((long)DTable + uVar29 * 4 + 6) + iVar11;
            bits[1] = CONCAT44(bits[1]._4_4_,uVar10);
            pBVar23 = pBVar23 + (ulong)*(byte *)((long)DTable + uVar29 * 4 + 7) + uVar17 + lVar9;
          }
          uVar17 = (long)pBVar31 - (long)pBVar23;
        }
        if (1 < uVar17) {
          uVar10 = (uint)bits[1];
          while (uVar10 < 0x41) {
            if (bits[2] < local_1a8) {
              if (bits[2] == bits[3]) break;
              bVar32 = bits[2] - (uVar10 >> 3) < bits[3];
              uVar22 = (int)bits[2] - (int)bits[3];
              if (!bVar32) {
                uVar22 = uVar10 >> 3;
              }
              BVar12 = (BIT_DStream_status)bVar32;
              bits[2] = bits[2] - uVar22;
              bits[1] = CONCAT44(bits[1]._4_4_,uVar10 + uVar22 * -8);
              bits[0] = *(U64 *)bits[2];
            }
            else {
              BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)bits);
            }
            if ((pBVar31 + -2 < pBVar23) || (BVar12 != BIT_DStream_unfinished)) break;
            uVar17 = (bits[0] << ((byte)bits[1] & 0x3f)) >> 0x35;
            *(short *)pBVar23 = (short)DTable[uVar17 + 1];
            uVar10 = *(byte *)((long)DTable + uVar17 * 4 + 6) + (uint)bits[1];
            bits[1] = CONCAT44(bits[1]._4_4_,uVar10);
            pBVar23 = pBVar23 + *(byte *)((long)DTable + uVar17 * 4 + 7);
          }
          for (; pBVar23 <= pBVar31 + -2;
              pBVar23 = pBVar23 + *(byte *)((long)DTable + uVar17 * 4 + 7)) {
            uVar17 = (bits[0] << ((byte)bits[1] & 0x3f)) >> 0x35;
            *(short *)pBVar23 = (short)DTable[uVar17 + 1];
            bits[1] = CONCAT44(bits[1]._4_4_,
                               (uint)bits[1] + *(byte *)((long)DTable + uVar17 * 4 + 6));
          }
        }
        if (pBVar23 < pBVar31) {
          *pBVar23 = (BYTE)DTable[((bits[0] << ((byte)bits[1] & 0x3f)) >> 0x35) + 1];
          pBVar23 = pBVar23 + 1;
        }
        pBVar6 = args.op[lVar28];
        args.op[lVar28] = pBVar23 + ((long)pBVar6 - (long)pBVar25);
        lVar28 = lVar28 + 1;
        if (pBVar23 + ((long)pBVar6 - (long)pBVar25) != pBVar31) {
          return 0xffffffffffffffec;
        }
      }
    }
    cSrcSize = (size_t)local_138;
    if (local_110 != 0) {
      return local_110;
    }
  }
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar17 = (ulong)*cSrc;
  uVar29 = (ulong)*(ushort *)((long)cSrc + 2);
  uVar27 = (ulong)*(ushort *)((long)cSrc + 4);
  uVar16 = uVar17 + uVar29 + uVar27 + 6;
  local_138 = (undefined2 *)(cSrcSize - uVar16);
  local_118 = (BYTE *)0xffffffffffffffec;
  if (dstSize < 6) {
    return 0xffffffffffffffec;
  }
  if (cSrcSize < uVar16) {
    return 0xffffffffffffffec;
  }
  puVar5 = (undefined2 *)((long)dst + dstSize);
  uVar16 = dstSize + 3 >> 2;
  local_128 = (undefined2 *)((long)dst + uVar16);
  local_120 = (undefined2 *)((long)local_128 + uVar16);
  puVar30 = (undefined2 *)(uVar16 + (long)local_120);
  if (puVar5 < puVar30) {
    return 0xffffffffffffffec;
  }
  uVar10 = (uint)*(byte *)((long)DTable + 2);
  local_110 = dstSize;
  sVar18 = BIT_initDStream((BIT_DStream_t *)&args,(ushort *)((long)cSrc + 6),uVar17);
  if (0xffffffffffffff88 < sVar18) {
    return sVar18;
  }
  pvVar24 = (void *)((long)cSrc + uVar17 + 6);
  sVar18 = BIT_initDStream((BIT_DStream_t *)bits,pvVar24,uVar29);
  if (0xffffffffffffff88 < sVar18) {
    return sVar18;
  }
  pvVar24 = (void *)((long)pvVar24 + uVar29);
  sVar18 = BIT_initDStream((BIT_DStream_t *)ip,pvVar24,uVar27);
  if (0xffffffffffffff88 < sVar18) {
    return sVar18;
  }
  sVar18 = BIT_initDStream((BIT_DStream_t *)local_168,(void *)((long)pvVar24 + uVar27),
                           (size_t)local_138);
  if (0xffffffffffffff88 < sVar18) {
    return sVar18;
  }
  puVar19 = (undefined2 *)((long)dst + (local_110 - 7));
  local_108 = puVar30;
  if ((ulong)((long)puVar5 - (long)puVar30) < 8) {
    local_130 = local_120;
    local_100 = local_128;
  }
  else {
    bVar32 = true;
    local_130 = local_120;
    local_100 = local_128;
    local_1a0 = (undefined2 *)dst;
    while ((dst = local_1a0, puVar30 < puVar19 && (bVar32))) {
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar10);
      *local_1a0 = (short)DTable[sVar18 + 1];
      args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                    (uint)args.ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      local_138 = puVar30;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar10);
      *(short *)((long)local_1a0 + uVar16) = (short)DTable[sVar18 + 1];
      args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                    (uint)args.ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar17 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      lVar28 = uVar17 + uVar16;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar10);
      *(short *)((long)local_1a0 + uVar17 + uVar16) = (short)DTable[sVar18 + 1];
      args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                    (uint)args.ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar10);
      *(short *)((long)local_1a0 + uVar16 + lVar28) = (short)DTable[sVar18 + 1];
      args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                    (uint)args.ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      local_1a0 = (undefined2 *)
                  ((long)local_1a0 + *(byte *)((long)DTable + sVar18 * 4 + 7) + uVar16 + lVar28);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar10);
      puVar30 = local_100;
      *local_100 = (short)DTable[sVar18 + 1];
      bits[1] = CONCAT44(bits[1]._4_4_,(uint)bits[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar10);
      *(short *)((long)puVar30 + uVar16) = (short)DTable[sVar18 + 1];
      bits[1] = CONCAT44(bits[1]._4_4_,(uint)bits[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar17 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      lVar28 = uVar17 + uVar16;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar10);
      *(short *)((long)puVar30 + uVar17 + uVar16) = (short)DTable[sVar18 + 1];
      bits[1] = CONCAT44(bits[1]._4_4_,(uint)bits[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar10);
      *(short *)((long)puVar30 + uVar16 + lVar28) = (short)DTable[sVar18 + 1];
      bits[1] = CONCAT44(bits[1]._4_4_,(uint)bits[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      local_100 = (undefined2 *)
                  ((long)puVar30 + *(byte *)((long)DTable + sVar18 * 4 + 7) + uVar16 + lVar28);
      BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)&args);
      BVar13 = BIT_reloadDStreamFast((BIT_DStream_t *)bits);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar10);
      puVar26 = local_130;
      *local_130 = (short)DTable[sVar18 + 1];
      ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,(uint)ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar10);
      *(short *)((long)puVar26 + uVar16) = (short)DTable[sVar18 + 1];
      ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,(uint)ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar17 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      lVar28 = uVar17 + uVar16;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar10);
      *(short *)((long)puVar26 + uVar17 + uVar16) = (short)DTable[sVar18 + 1];
      ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,(uint)ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar10);
      *(short *)((long)puVar26 + uVar16 + lVar28) = (short)DTable[sVar18 + 1];
      ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,(uint)ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      local_130 = (ushort *)
                  ((long)puVar26 + *(byte *)((long)DTable + sVar18 * 4 + 7) + uVar16 + lVar28);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)local_168,uVar10);
      puVar30 = local_138;
      *local_138 = (short)DTable[sVar18 + 1];
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      local_168._8_4_ = local_168._8_4_ + (uint)*(byte *)((long)DTable + sVar18 * 4 + 6);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)local_168,uVar10);
      *(short *)((long)puVar30 + uVar16) = (short)DTable[sVar18 + 1];
      local_168._8_4_ = local_168._8_4_ + (uint)*(byte *)((long)DTable + sVar18 * 4 + 6);
      uVar17 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      lVar28 = uVar17 + uVar16;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)local_168,uVar10);
      *(short *)((long)puVar30 + uVar17 + uVar16) = (short)DTable[sVar18 + 1];
      local_168._8_4_ = local_168._8_4_ + (uint)*(byte *)((long)DTable + sVar18 * 4 + 6);
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)local_168,uVar10);
      *(short *)((long)puVar30 + uVar16 + lVar28) = (short)DTable[sVar18 + 1];
      local_168._8_4_ = local_168._8_4_ + (uint)*(byte *)((long)DTable + sVar18 * 4 + 6);
      puVar30 = (undefined2 *)
                ((long)puVar30 + *(byte *)((long)DTable + sVar18 * 4 + 7) + uVar16 + lVar28);
      BVar14 = BIT_reloadDStreamFast((BIT_DStream_t *)ip);
      BVar15 = BIT_reloadDStreamFast((BIT_DStream_t *)local_168);
      bVar32 = BVar15 == BIT_DStream_unfinished &&
               (BVar14 == BIT_DStream_unfinished &&
               (BVar13 == BIT_DStream_unfinished && BVar12 == BIT_DStream_unfinished));
    }
  }
  if (local_128 < dst) {
    return (size_t)local_118;
  }
  if (local_120 < local_100) {
    return (size_t)local_118;
  }
  if (local_108 < local_130) {
    return (size_t)local_118;
  }
  local_138 = puVar30;
  if ((ulong)((long)local_128 - (long)dst) < 8) {
    if ((uint)args.ip[1] < 0x41) {
      if (args.ip[2] < args.op[0]) {
        if (args.ip[2] != args.ip[3]) {
          uVar22 = (int)args.ip[2] - (int)args.ip[3];
          if (args.ip[3] <= args.ip[2] + -(ulong)((uint)args.ip[1] >> 3)) {
            uVar22 = (uint)args.ip[1] >> 3;
          }
          args.ip[2] = args.ip[2] + -(ulong)uVar22;
          args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,(uint)args.ip[1] + uVar22 * -8);
          args.ip[0] = *(BYTE **)args.ip[2];
        }
      }
      else {
        BIT_reloadDStreamFast((BIT_DStream_t *)&args);
      }
    }
  }
  else if (uVar10 < 0xc) {
    puVar20 = (undefined2 *)((long)local_128 + -9);
    uVar22 = (uint)args.ip[1];
    while (puVar30 = local_138, uVar22 < 0x41) {
      if (args.ip[2] < args.op[0]) {
        if (args.ip[2] == args.ip[3]) break;
        uVar7 = (int)args.ip[2] - (int)args.ip[3];
        if (args.ip[2] + -(ulong)(uVar22 >> 3) >= args.ip[3]) {
          uVar7 = uVar22 >> 3;
        }
        BVar12 = (BIT_DStream_status)(args.ip[2] + -(ulong)(uVar22 >> 3) < args.ip[3]);
        args.ip[2] = args.ip[2] + -(ulong)uVar7;
        args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,uVar22 + uVar7 * -8);
        args.ip[0] = *(BYTE **)args.ip[2];
      }
      else {
        BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)&args);
      }
      if ((puVar20 <= dst) || (BVar12 != BIT_DStream_unfinished)) break;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar10);
      *(short *)dst = (short)DTable[sVar18 + 1];
      args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                    (uint)args.ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar10);
      *(short *)((long)dst + uVar16) = (short)DTable[sVar18 + 1];
      args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                    (uint)args.ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar17 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      lVar28 = uVar17 + uVar16;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar10);
      *(short *)((long)dst + uVar17 + uVar16) = (short)DTable[sVar18 + 1];
      args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                    (uint)args.ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      lVar8 = uVar16 + lVar28;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar10);
      *(short *)((long)dst + uVar16 + lVar28) = (short)DTable[sVar18 + 1];
      args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                    (uint)args.ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar10);
      *(short *)((long)dst + uVar16 + lVar8) = (short)DTable[sVar18 + 1];
      uVar22 = *(byte *)((long)DTable + sVar18 * 4 + 6) + (uint)args.ip[1];
      args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,uVar22);
      dst = (void *)((long)dst + *(byte *)((long)DTable + sVar18 * 4 + 7) + uVar16 + lVar8);
    }
  }
  else {
    puVar20 = (undefined2 *)((long)local_128 + -7);
    uVar22 = (uint)args.ip[1];
    while (puVar30 = local_138, uVar22 < 0x41) {
      if (args.ip[2] < args.op[0]) {
        if (args.ip[2] == args.ip[3]) break;
        uVar7 = (int)args.ip[2] - (int)args.ip[3];
        if (args.ip[2] + -(ulong)(uVar22 >> 3) >= args.ip[3]) {
          uVar7 = uVar22 >> 3;
        }
        BVar12 = (BIT_DStream_status)(args.ip[2] + -(ulong)(uVar22 >> 3) < args.ip[3]);
        args.ip[2] = args.ip[2] + -(ulong)uVar7;
        args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,uVar22 + uVar7 * -8);
        args.ip[0] = *(BYTE **)args.ip[2];
      }
      else {
        BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)&args);
      }
      if ((puVar20 <= dst) || (BVar12 != BIT_DStream_unfinished)) break;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar10);
      *(short *)dst = (short)DTable[sVar18 + 1];
      args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                    (uint)args.ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar10);
      *(short *)((long)dst + uVar16) = (short)DTable[sVar18 + 1];
      args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                    (uint)args.ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar17 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      lVar28 = uVar17 + uVar16;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar10);
      *(short *)((long)dst + uVar17 + uVar16) = (short)DTable[sVar18 + 1];
      args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                    (uint)args.ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar10);
      *(short *)((long)dst + uVar16 + lVar28) = (short)DTable[sVar18 + 1];
      uVar22 = *(byte *)((long)DTable + sVar18 * 4 + 6) + (uint)args.ip[1];
      args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,uVar22);
      dst = (void *)((long)dst + *(byte *)((long)DTable + sVar18 * 4 + 7) + uVar16 + lVar28);
    }
  }
  if (1 < (ulong)((long)local_128 - (long)dst)) {
    puVar20 = local_128 + -1;
    uVar22 = (uint)args.ip[1];
    while (uVar22 < 0x41) {
      if (args.ip[2] < args.op[0]) {
        if (args.ip[2] == args.ip[3]) break;
        uVar7 = (int)args.ip[2] - (int)args.ip[3];
        if (args.ip[2] + -(ulong)(uVar22 >> 3) >= args.ip[3]) {
          uVar7 = uVar22 >> 3;
        }
        BVar12 = (BIT_DStream_status)(args.ip[2] + -(ulong)(uVar22 >> 3) < args.ip[3]);
        args.ip[2] = args.ip[2] + -(ulong)uVar7;
        args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,uVar22 + uVar7 * -8);
        args.ip[0] = *(BYTE **)args.ip[2];
      }
      else {
        BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)&args);
      }
      if ((puVar20 < dst) || (BVar12 != BIT_DStream_unfinished)) break;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar10);
      *(short *)dst = (short)DTable[sVar18 + 1];
      uVar22 = *(byte *)((long)DTable + sVar18 * 4 + 6) + (uint)args.ip[1];
      args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,uVar22);
      dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7));
    }
    for (; dst <= puVar20;
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7))) {
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar10);
      *(short *)dst = (short)DTable[sVar18 + 1];
      args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                    (uint)args.ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
    }
  }
  if (dst < local_128) {
    sVar18 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar10);
    *(char *)dst = (char)DTable[sVar18 + 1];
    if (*(char *)((long)DTable + sVar18 * 4 + 7) == '\x01') {
      args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                    (uint)args.ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
    }
    else if ((uint)args.ip[1] < 0x40) {
      uVar22 = (uint)args.ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6);
      if (0x3f < uVar22) {
        uVar22 = 0x40;
      }
      args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,uVar22);
    }
  }
  puVar20 = local_100;
  puVar26 = local_130;
  if ((ulong)((long)local_120 - (long)local_100) < 8) {
    if ((uint)bits[1] < 0x41) {
      if (bits[2] < local_1a8) {
        if (bits[2] != bits[3]) {
          uVar22 = (int)bits[2] - (int)bits[3];
          if (bits[3] <= bits[2] - ((uint)bits[1] >> 3)) {
            uVar22 = (uint)bits[1] >> 3;
          }
          bits[2] = bits[2] - uVar22;
          bits[1] = CONCAT44(bits[1]._4_4_,(uint)bits[1] + uVar22 * -8);
          bits[0] = *(U64 *)bits[2];
        }
      }
      else {
        BIT_reloadDStreamFast((BIT_DStream_t *)bits);
      }
    }
  }
  else if (uVar10 < 0xc) {
    puVar21 = (undefined2 *)((long)local_120 + -9);
    uVar22 = (uint)bits[1];
    while (puVar26 = local_130, uVar22 < 0x41) {
      if (bits[2] < local_1a8) {
        if (bits[2] == bits[3]) break;
        bVar32 = bits[2] - (uVar22 >> 3) < bits[3];
        uVar7 = (int)bits[2] - (int)bits[3];
        if (!bVar32) {
          uVar7 = uVar22 >> 3;
        }
        BVar12 = (BIT_DStream_status)bVar32;
        bits[2] = bits[2] - uVar7;
        bits[1] = CONCAT44(bits[1]._4_4_,uVar22 + uVar7 * -8);
        bits[0] = *(U64 *)bits[2];
      }
      else {
        BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)bits);
      }
      if ((puVar21 <= puVar20) || (BVar12 != BIT_DStream_unfinished)) break;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar10);
      *puVar20 = (short)DTable[sVar18 + 1];
      bits[1] = CONCAT44(bits[1]._4_4_,(uint)bits[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar10);
      *(short *)((long)puVar20 + uVar16) = (short)DTable[sVar18 + 1];
      bits[1] = CONCAT44(bits[1]._4_4_,(uint)bits[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar17 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      lVar28 = uVar17 + uVar16;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar10);
      *(short *)((long)puVar20 + uVar17 + uVar16) = (short)DTable[sVar18 + 1];
      bits[1] = CONCAT44(bits[1]._4_4_,(uint)bits[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      lVar8 = uVar16 + lVar28;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar10);
      *(short *)((long)puVar20 + uVar16 + lVar28) = (short)DTable[sVar18 + 1];
      bits[1] = CONCAT44(bits[1]._4_4_,(uint)bits[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar10);
      *(short *)((long)puVar20 + uVar16 + lVar8) = (short)DTable[sVar18 + 1];
      uVar22 = *(byte *)((long)DTable + sVar18 * 4 + 6) + (uint)bits[1];
      bits[1] = CONCAT44(bits[1]._4_4_,uVar22);
      puVar20 = (undefined2 *)
                ((long)puVar20 + *(byte *)((long)DTable + sVar18 * 4 + 7) + uVar16 + lVar8);
      puVar30 = local_138;
    }
  }
  else {
    puVar21 = (undefined2 *)((long)local_120 + -7);
    uVar22 = (uint)bits[1];
    while (puVar26 = local_130, uVar22 < 0x41) {
      if (bits[2] < local_1a8) {
        if (bits[2] == bits[3]) break;
        bVar32 = bits[2] - (uVar22 >> 3) < bits[3];
        uVar7 = (int)bits[2] - (int)bits[3];
        if (!bVar32) {
          uVar7 = uVar22 >> 3;
        }
        BVar12 = (BIT_DStream_status)bVar32;
        bits[2] = bits[2] - uVar7;
        bits[1] = CONCAT44(bits[1]._4_4_,uVar22 + uVar7 * -8);
        bits[0] = *(U64 *)bits[2];
      }
      else {
        BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)bits);
      }
      if ((puVar21 <= puVar20) || (BVar12 != BIT_DStream_unfinished)) break;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar10);
      *puVar20 = (short)DTable[sVar18 + 1];
      bits[1] = CONCAT44(bits[1]._4_4_,(uint)bits[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar10);
      *(short *)((long)puVar20 + uVar16) = (short)DTable[sVar18 + 1];
      bits[1] = CONCAT44(bits[1]._4_4_,(uint)bits[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar17 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      lVar28 = uVar17 + uVar16;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar10);
      *(short *)((long)puVar20 + uVar17 + uVar16) = (short)DTable[sVar18 + 1];
      bits[1] = CONCAT44(bits[1]._4_4_,(uint)bits[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar10);
      *(short *)((long)puVar20 + uVar16 + lVar28) = (short)DTable[sVar18 + 1];
      uVar22 = *(byte *)((long)DTable + sVar18 * 4 + 6) + (uint)bits[1];
      bits[1] = CONCAT44(bits[1]._4_4_,uVar22);
      puVar20 = (undefined2 *)
                ((long)puVar20 + *(byte *)((long)DTable + sVar18 * 4 + 7) + uVar16 + lVar28);
      puVar30 = local_138;
    }
  }
  if (1 < (ulong)((long)local_120 - (long)puVar20)) {
    puVar21 = local_120 + -1;
    uVar22 = (uint)bits[1];
    while (uVar22 < 0x41) {
      if (bits[2] < local_1a8) {
        if (bits[2] == bits[3]) break;
        bVar32 = bits[2] - (uVar22 >> 3) < bits[3];
        uVar7 = (int)bits[2] - (int)bits[3];
        if (!bVar32) {
          uVar7 = uVar22 >> 3;
        }
        BVar12 = (BIT_DStream_status)bVar32;
        bits[2] = bits[2] - uVar7;
        bits[1] = CONCAT44(bits[1]._4_4_,uVar22 + uVar7 * -8);
        bits[0] = *(U64 *)bits[2];
      }
      else {
        BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)bits);
      }
      if ((puVar21 < puVar20) || (BVar12 != BIT_DStream_unfinished)) break;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar10);
      *puVar20 = (short)DTable[sVar18 + 1];
      uVar22 = *(byte *)((long)DTable + sVar18 * 4 + 6) + (uint)bits[1];
      bits[1] = CONCAT44(bits[1]._4_4_,uVar22);
      puVar20 = (undefined2 *)((long)puVar20 + (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7));
    }
    for (; puVar20 <= puVar21;
        puVar20 = (undefined2 *)((long)puVar20 + (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7))) {
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar10);
      *puVar20 = (short)DTable[sVar18 + 1];
      bits[1] = CONCAT44(bits[1]._4_4_,(uint)bits[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
    }
  }
  if (puVar20 < local_120) {
    sVar18 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar10);
    *(char *)puVar20 = (char)DTable[sVar18 + 1];
    if (*(char *)((long)DTable + sVar18 * 4 + 7) == '\x01') {
      bits[1] = CONCAT44(bits[1]._4_4_,(uint)bits[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
    }
    else if ((uint)bits[1] < 0x40) {
      uVar22 = (uint)bits[1] + *(byte *)((long)DTable + sVar18 * 4 + 6);
      if (0x3f < uVar22) {
        uVar22 = 0x40;
      }
      bits[1] = CONCAT44(bits[1]._4_4_,uVar22);
    }
  }
  if ((ulong)((long)local_108 - (long)puVar26) < 8) {
    if ((uint)ip[1] < 0x41) {
      if (ip[2] < local_178) {
        if (ip[2] != ip[3]) {
          uVar22 = (int)ip[2] - (int)ip[3];
          if (ip[3] <= ip[2] + -(ulong)((uint)ip[1] >> 3)) {
            uVar22 = (uint)ip[1] >> 3;
          }
          ip[2] = ip[2] + -(ulong)uVar22;
          ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,(uint)ip[1] + uVar22 * -8);
          ip[0] = *(BYTE **)ip[2];
        }
      }
      else {
        BIT_reloadDStreamFast((BIT_DStream_t *)ip);
      }
    }
  }
  else if (uVar10 < 0xc) {
    puVar20 = (undefined2 *)((long)local_108 + -9);
    uVar22 = (uint)ip[1];
    while (uVar22 < 0x41) {
      if (ip[2] < local_178) {
        if (ip[2] == ip[3]) break;
        uVar7 = (int)ip[2] - (int)ip[3];
        if (ip[2] + -(ulong)(uVar22 >> 3) >= ip[3]) {
          uVar7 = uVar22 >> 3;
        }
        BVar12 = (BIT_DStream_status)(ip[2] + -(ulong)(uVar22 >> 3) < ip[3]);
        ip[2] = ip[2] + -(ulong)uVar7;
        ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,uVar22 + uVar7 * -8);
        ip[0] = *(BYTE **)ip[2];
      }
      else {
        BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)ip);
      }
      if ((puVar20 <= puVar26) || (BVar12 != BIT_DStream_unfinished)) break;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar10);
      *puVar26 = (short)DTable[sVar18 + 1];
      ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,(uint)ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar10);
      *(short *)((long)puVar26 + uVar16) = (short)DTable[sVar18 + 1];
      ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,(uint)ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar17 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      lVar28 = uVar17 + uVar16;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar10);
      *(short *)((long)puVar26 + uVar17 + uVar16) = (short)DTable[sVar18 + 1];
      ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,(uint)ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      lVar8 = uVar16 + lVar28;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar10);
      *(short *)((long)puVar26 + uVar16 + lVar28) = (short)DTable[sVar18 + 1];
      ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,(uint)ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar10);
      *(short *)((long)puVar26 + uVar16 + lVar8) = (short)DTable[sVar18 + 1];
      uVar22 = *(byte *)((long)DTable + sVar18 * 4 + 6) + (uint)ip[1];
      ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,uVar22);
      puVar26 = (ushort *)
                ((long)puVar26 + *(byte *)((long)DTable + sVar18 * 4 + 7) + uVar16 + lVar8);
      puVar30 = local_138;
    }
  }
  else {
    puVar20 = (undefined2 *)((long)local_108 - 7);
    uVar22 = (uint)ip[1];
    while (uVar22 < 0x41) {
      if (ip[2] < local_178) {
        if (ip[2] == ip[3]) break;
        uVar7 = (int)ip[2] - (int)ip[3];
        if (ip[2] + -(ulong)(uVar22 >> 3) >= ip[3]) {
          uVar7 = uVar22 >> 3;
        }
        BVar12 = (BIT_DStream_status)(ip[2] + -(ulong)(uVar22 >> 3) < ip[3]);
        ip[2] = ip[2] + -(ulong)uVar7;
        ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,uVar22 + uVar7 * -8);
        ip[0] = *(BYTE **)ip[2];
      }
      else {
        BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)ip);
      }
      if ((puVar20 <= puVar26) || (BVar12 != BIT_DStream_unfinished)) break;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar10);
      *puVar26 = (short)DTable[sVar18 + 1];
      ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,(uint)ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar10);
      *(short *)((long)puVar26 + uVar16) = (short)DTable[sVar18 + 1];
      ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,(uint)ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar17 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      lVar28 = uVar17 + uVar16;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar10);
      *(short *)((long)puVar26 + uVar17 + uVar16) = (short)DTable[sVar18 + 1];
      ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,(uint)ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar10);
      *(short *)((long)puVar26 + uVar16 + lVar28) = (short)DTable[sVar18 + 1];
      uVar22 = *(byte *)((long)DTable + sVar18 * 4 + 6) + (uint)ip[1];
      ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,uVar22);
      puVar26 = (ushort *)
                ((long)puVar26 + *(byte *)((long)DTable + sVar18 * 4 + 7) + uVar16 + lVar28);
      puVar30 = local_138;
    }
  }
  puVar20 = local_108;
  if (1 < (ulong)((long)local_108 - (long)puVar26)) {
    puVar21 = local_108 + -1;
    uVar22 = (uint)ip[1];
    while (uVar22 < 0x41) {
      if (ip[2] < local_178) {
        if (ip[2] == ip[3]) break;
        uVar7 = (int)ip[2] - (int)ip[3];
        if (ip[2] + -(ulong)(uVar22 >> 3) >= ip[3]) {
          uVar7 = uVar22 >> 3;
        }
        BVar12 = (BIT_DStream_status)(ip[2] + -(ulong)(uVar22 >> 3) < ip[3]);
        ip[2] = ip[2] + -(ulong)uVar7;
        ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,uVar22 + uVar7 * -8);
        ip[0] = *(BYTE **)ip[2];
      }
      else {
        BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)ip);
      }
      if ((puVar21 < puVar26) || (BVar12 != BIT_DStream_unfinished)) break;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar10);
      *puVar26 = (short)DTable[sVar18 + 1];
      uVar22 = *(byte *)((long)DTable + sVar18 * 4 + 6) + (uint)ip[1];
      ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,uVar22);
      puVar26 = (ushort *)((long)puVar26 + (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7));
    }
    for (; puVar26 <= puVar21;
        puVar26 = (ushort *)((long)puVar26 + (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7))) {
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar10);
      *puVar26 = (short)DTable[sVar18 + 1];
      ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,(uint)ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
    }
  }
  if (puVar26 < puVar20) {
    sVar18 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar10);
    *(char *)puVar26 = (char)DTable[sVar18 + 1];
    if (*(char *)((long)DTable + sVar18 * 4 + 7) == '\x01') {
      ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,(uint)ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6));
    }
    else if ((uint)ip[1] < 0x40) {
      uVar22 = (uint)ip[1] + *(byte *)((long)DTable + sVar18 * 4 + 6);
      if (0x3f < uVar22) {
        uVar22 = 0x40;
      }
      ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,uVar22);
    }
  }
  if ((ulong)((long)puVar5 - (long)puVar30) < 8) {
    if ((uint)local_168._8_4_ < 0x41) {
      if (local_158 < local_148) {
        if (local_158 != pBStack_150) {
          uVar22 = (int)local_158 - (int)pBStack_150;
          if (pBStack_150 <= local_158 + -(ulong)((uint)local_168._8_4_ >> 3)) {
            uVar22 = (uint)local_168._8_4_ >> 3;
          }
          local_158 = local_158 + -(ulong)uVar22;
          local_168._8_4_ = local_168._8_4_ + uVar22 * -8;
          local_168._0_8_ = *(undefined8 *)local_158;
        }
      }
      else {
        BIT_reloadDStreamFast((BIT_DStream_t *)local_168);
      }
    }
  }
  else if (uVar10 < 0xc) {
    uVar22 = local_168._8_4_;
    while (uVar22 < 0x41) {
      if (local_158 < local_148) {
        if (local_158 == pBStack_150) break;
        uVar7 = (int)local_158 - (int)pBStack_150;
        if (local_158 + -(ulong)(uVar22 >> 3) >= pBStack_150) {
          uVar7 = uVar22 >> 3;
        }
        BVar12 = (BIT_DStream_status)(local_158 + -(ulong)(uVar22 >> 3) < pBStack_150);
        local_158 = local_158 + -(ulong)uVar7;
        local_168._8_4_ = uVar22 + uVar7 * -8;
        local_168._0_8_ = *(undefined8 *)local_158;
      }
      else {
        BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)local_168);
      }
      if (((undefined2 *)((long)puVar5 - 9U) <= puVar30) || (BVar12 != BIT_DStream_unfinished))
      break;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)local_168,uVar10);
      *puVar30 = (short)DTable[sVar18 + 1];
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      local_168._8_4_ = local_168._8_4_ + (uint)*(byte *)((long)DTable + sVar18 * 4 + 6);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)local_168,uVar10);
      *(short *)((long)puVar30 + uVar16) = (short)DTable[sVar18 + 1];
      local_168._8_4_ = local_168._8_4_ + (uint)*(byte *)((long)DTable + sVar18 * 4 + 6);
      uVar17 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      lVar28 = uVar17 + uVar16;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)local_168,uVar10);
      *(short *)((long)puVar30 + uVar17 + uVar16) = (short)DTable[sVar18 + 1];
      local_168._8_4_ = local_168._8_4_ + (uint)*(byte *)((long)DTable + sVar18 * 4 + 6);
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      lVar8 = uVar16 + lVar28;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)local_168,uVar10);
      *(short *)((long)puVar30 + uVar16 + lVar28) = (short)DTable[sVar18 + 1];
      local_168._8_4_ = local_168._8_4_ + (uint)*(byte *)((long)DTable + sVar18 * 4 + 6);
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)local_168,uVar10);
      *(short *)((long)puVar30 + uVar16 + lVar8) = (short)DTable[sVar18 + 1];
      uVar22 = (uint)*(byte *)((long)DTable + sVar18 * 4 + 6) + local_168._8_4_;
      local_168._8_4_ = uVar22;
      puVar30 = (undefined2 *)
                ((long)puVar30 + *(byte *)((long)DTable + sVar18 * 4 + 7) + uVar16 + lVar8);
    }
  }
  else {
    uVar22 = local_168._8_4_;
    while (uVar22 < 0x41) {
      if (local_158 < local_148) {
        if (local_158 == pBStack_150) break;
        uVar7 = (int)local_158 - (int)pBStack_150;
        if (local_158 + -(ulong)(uVar22 >> 3) >= pBStack_150) {
          uVar7 = uVar22 >> 3;
        }
        BVar12 = (BIT_DStream_status)(local_158 + -(ulong)(uVar22 >> 3) < pBStack_150);
        local_158 = local_158 + -(ulong)uVar7;
        local_168._8_4_ = uVar22 + uVar7 * -8;
        local_168._0_8_ = *(undefined8 *)local_158;
      }
      else {
        BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)local_168);
      }
      if ((puVar19 <= puVar30) || (BVar12 != BIT_DStream_unfinished)) break;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)local_168,uVar10);
      *puVar30 = (short)DTable[sVar18 + 1];
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      local_168._8_4_ = local_168._8_4_ + (uint)*(byte *)((long)DTable + sVar18 * 4 + 6);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)local_168,uVar10);
      *(short *)((long)puVar30 + uVar16) = (short)DTable[sVar18 + 1];
      local_168._8_4_ = local_168._8_4_ + (uint)*(byte *)((long)DTable + sVar18 * 4 + 6);
      uVar17 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      lVar28 = uVar17 + uVar16;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)local_168,uVar10);
      *(short *)((long)puVar30 + uVar17 + uVar16) = (short)DTable[sVar18 + 1];
      local_168._8_4_ = local_168._8_4_ + (uint)*(byte *)((long)DTable + sVar18 * 4 + 6);
      uVar16 = (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7);
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)local_168,uVar10);
      *(short *)((long)puVar30 + uVar16 + lVar28) = (short)DTable[sVar18 + 1];
      uVar22 = (uint)*(byte *)((long)DTable + sVar18 * 4 + 6) + local_168._8_4_;
      local_168._8_4_ = uVar22;
      puVar30 = (undefined2 *)
                ((long)puVar30 + *(byte *)((long)DTable + sVar18 * 4 + 7) + uVar16 + lVar28);
    }
  }
  if (1 < (ulong)((long)puVar5 - (long)puVar30)) {
    uVar22 = local_168._8_4_;
    while (uVar22 < 0x41) {
      if (local_158 < local_148) {
        if (local_158 == pBStack_150) break;
        uVar7 = (int)local_158 - (int)pBStack_150;
        if (local_158 + -(ulong)(uVar22 >> 3) >= pBStack_150) {
          uVar7 = uVar22 >> 3;
        }
        BVar12 = (BIT_DStream_status)(local_158 + -(ulong)(uVar22 >> 3) < pBStack_150);
        local_158 = local_158 + -(ulong)uVar7;
        local_168._8_4_ = uVar22 + uVar7 * -8;
        local_168._0_8_ = *(undefined8 *)local_158;
      }
      else {
        BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)local_168);
      }
      if ((puVar5 + -1 < puVar30) || (BVar12 != BIT_DStream_unfinished)) break;
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)local_168,uVar10);
      *puVar30 = (short)DTable[sVar18 + 1];
      uVar22 = (uint)*(byte *)((long)DTable + sVar18 * 4 + 6) + local_168._8_4_;
      local_168._8_4_ = uVar22;
      puVar30 = (undefined2 *)((long)puVar30 + (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7));
    }
    for (; puVar30 <= puVar5 + -1;
        puVar30 = (undefined2 *)((long)puVar30 + (ulong)*(byte *)((long)DTable + sVar18 * 4 + 7))) {
      sVar18 = BIT_lookBitsFast((BIT_DStream_t *)local_168,uVar10);
      *puVar30 = (short)DTable[sVar18 + 1];
      local_168._8_4_ = local_168._8_4_ + (uint)*(byte *)((long)DTable + sVar18 * 4 + 6);
    }
  }
  if (puVar30 < puVar5) {
    sVar18 = BIT_lookBitsFast((BIT_DStream_t *)local_168,uVar10);
    *(char *)puVar30 = (char)DTable[sVar18 + 1];
    if (*(char *)((long)DTable + sVar18 * 4 + 7) == '\x01') {
      local_168._8_4_ = (uint)*(byte *)((long)DTable + sVar18 * 4 + 6) + local_168._8_4_;
    }
    else if ((uint)local_168._8_4_ < 0x40) {
      local_168._8_4_ = local_168._8_4_ + (uint)*(byte *)((long)DTable + sVar18 * 4 + 6);
      if (0x3f < (uint)local_168._8_4_) {
        local_168._8_4_ = 0x40;
      }
    }
  }
  else {
  }
  sVar18 = 0xffffffffffffffec;
  if (local_168._8_4_ != 0x40) {
    local_110 = sVar18;
  }
  if (local_158 != pBStack_150) {
    local_110 = sVar18;
  }
  if ((uint)ip[1] != 0x40) {
    local_110 = sVar18;
  }
  if (ip[2] != ip[3]) {
    local_110 = sVar18;
  }
  if ((uint)bits[1] != 0x40) {
    local_110 = sVar18;
  }
  if (bits[2] != bits[3]) {
    local_110 = sVar18;
  }
  if ((uint)args.ip[1] != 0x40) {
    local_110 = sVar18;
  }
  if (args.ip[2] != args.ip[3]) {
    return 0xffffffffffffffec;
  }
  return local_110;
}

Assistant:

static size_t HUF_decompress4X2_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X2_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X2_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X2_usingDTable_internal_bmi2;
# if ZSTD_ENABLE_ASM_X86_64_BMI2
        if (!(flags & HUF_flags_disableAsm)) {
            loopFn = HUF_decompress4X2_usingDTable_internal_fast_asm_loop;
        }
# endif
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif

#if ZSTD_ENABLE_ASM_X86_64_BMI2 && defined(__BMI2__)
    if (!(flags & HUF_flags_disableAsm)) {
        loopFn = HUF_decompress4X2_usingDTable_internal_fast_asm_loop;
    }
#endif

    if (!(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X2_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}